

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O2

void __thiscall
m2d::savanna::ssl_reuse::
http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::on_read_l(http_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
            *this,error_code ec,size_t bytes_transferred)

{
  delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *pdVar1;
  bool bVar2;
  type piVar3;
  error_code ec_local;
  error_condition local_1c8;
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_1b8;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_110;
  
  ec_local.cat_ = ec.cat_;
  ec_local._0_8_ = ec._0_8_;
  if (((ulong)ec_local._0_8_ >> 0x20 & 1) != 0) {
    local_1c8 = boost::system::errc::make_error_condition(not_connected);
    bVar2 = boost::system::operator!=(&ec_local,&local_1c8);
    if (bVar2) {
      (*(this->super_interface)._vptr_interface[8])(this,ec_local._0_8_,ec_local.cat_);
    }
  }
  piVar3 = boost::
           shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>::impl_type>
           ::operator->(&((this->tcp_stream_).
                          super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->impl_);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::shutdown(&(piVar3->socket).
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ,2,(int)&ec_local);
  if (ec_local.failed_ == true) {
    local_1c8 = boost::system::errc::make_error_condition(not_connected);
    bVar2 = boost::system::operator!=(&ec_local,&local_1c8);
    if (bVar2) {
      (*(this->super_interface)._vptr_interface[8])(this,ec_local._0_8_,ec_local.cat_);
      return;
    }
  }
  pdVar1 = this->delegate_;
  if (pdVar1 != (delegate<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
                 *)0x0) {
    boost::beast::http::
    message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::message(&local_1b8,&this->response_);
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::result(&local_110,&local_1b8);
    (**pdVar1->_vptr_delegate)(pdVar1,&local_110);
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::~result(&local_110);
    boost::beast::http::
    message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::~message(&local_1b8);
  }
  return;
}

Assistant:

void on_read_l(beast::error_code ec, std::size_t bytes_transferred) override {
			if (ec && ec != beast::errc::not_connected) {
				error_callback(ec);
			}
			tcp_stream_->socket().shutdown(tcp::socket::shutdown_both, ec);
			if (ec && ec != beast::errc::not_connected) {
				error_callback(ec);
			}else {
				if(delegate_) delegate_->completion_callback(savanna::result<http::response<Body>>(std::move(response_)));
			}
		}